

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O3

void ExpReplay::predict_or_learn<true,COST_SENSITIVE::cs_label>
               (expreplay *er,single_learner *base,example *ec)

{
  polylabel *ppVar1;
  example *peVar2;
  label_t lVar3;
  wclass *pwVar4;
  size_t sVar5;
  bool *pbVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20));
  ppVar1 = &ec->l;
  fVar9 = (float)(*(code *)PTR_weight_002d8b00)(ppVar1);
  if ((fVar9 != 0.0) || (NAN(fVar9))) {
    if (1 < er->replay_count) {
      uVar8 = 1;
      do {
        fVar9 = merand48(&er->all->random_state);
        fVar9 = fVar9 * (float)er->N;
        uVar7 = (ulong)fVar9;
        uVar7 = (long)(fVar9 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7;
        if (er->filled[uVar7] == true) {
          (**(code **)(base + 0x28))
                    (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),er->buf + uVar7);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < er->replay_count);
    }
    fVar9 = merand48(&er->all->random_state);
    pbVar6 = er->filled;
    fVar9 = fVar9 * (float)er->N;
    uVar8 = (ulong)fVar9;
    uVar8 = (long)(fVar9 - 9.223372e+18) & (long)uVar8 >> 0x3f | uVar8;
    if (pbVar6[uVar8] != false) {
      (**(code **)(base + 0x28))
                (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),er->buf + uVar8);
      pbVar6 = er->filled;
    }
    pbVar6[uVar8] = true;
    VW::copy_example_data(er->all->audit,er->buf + uVar8,ec);
    peVar2 = er->buf;
    if (PTR_copy_label_002d8b08 != (undefined *)0x0) {
      (*(code *)PTR_copy_label_002d8b08)(&peVar2[uVar8].l,ppVar1);
      return;
    }
    peVar2[uVar8].l.cb_eval.event.costs.erase_count = (ec->l).cb_eval.event.costs.erase_count;
    lVar3 = ppVar1->multi;
    pwVar4 = (ec->l).cs.costs._end;
    sVar5 = (ec->l).cs.costs.erase_count;
    peVar2[uVar8].l.cs.costs.end_array = (ec->l).cs.costs.end_array;
    peVar2[uVar8].l.cs.costs.erase_count = sVar5;
    peVar2[uVar8].l.multi = lVar3;
    peVar2[uVar8].l.cs.costs._end = pwVar4;
  }
  return;
}

Assistant:

void predict_or_learn(expreplay& er, LEARNER::single_learner& base, example& ec)
{  // regardless of what happens, we must predict
  base.predict(ec);
  // if we're not learning, that's all that has to happen
  if (!is_learn || lp.get_weight(&ec.l) == 0.)
    return;

  for (size_t replay = 1; replay < er.replay_count; replay++)
  {
    size_t n = (size_t)(merand48(er.all->random_state) * (float)er.N);
    if (er.filled[n])
      base.learn(er.buf[n]);
  }

  size_t n = (size_t)(merand48(er.all->random_state) * (float)er.N);
  if (er.filled[n])
    base.learn(er.buf[n]);

  er.filled[n] = true;
  VW::copy_example_data(er.all->audit, &er.buf[n], &ec);  // don't copy the label
  if (lp.copy_label)
    lp.copy_label(&er.buf[n].l, &ec.l);
  else
    er.buf[n].l = ec.l;
}